

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar3 = "tcp != NULL";
    uVar2 = 0x81;
  }
  else if (nread < 0) {
    if (nread == -0xfff) {
      puts("GOT EOF");
      uv_close(tcp,close_cb);
      return;
    }
    pcVar3 = "nread == UV_EOF";
    uVar2 = 0x87;
  }
  else {
    lVar1 = 0;
    do {
      if (nread == lVar1) {
        return;
      }
      pcVar3 = buf->base + lVar1;
      lVar1 = lVar1 + 1;
    } while (*pcVar3 == 'P');
    pcVar3 = "buf->base[i] == \'P\'";
    uVar2 = 0x85;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT(tcp != NULL);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT(buf->base[i] == 'P');
  } else {
    ASSERT(nread == UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}